

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_vif_linux.c
# Opt level: O2

int os_vif_linux_open(os_fd *sock,os_vif *vif)

{
  vif_type vVar1;
  oonf_log_source oVar2;
  int __fd;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  undefined2 uVar6;
  int iVar7;
  ulong uVar8;
  ifreq if_req;
  
  vVar1 = vif->type;
  if (vVar1 == OS_VIF_MAC) {
    uVar6 = 0x1002;
  }
  else {
    if (vVar1 != OS_VIF_IP) {
      if (((&log_global_mask)[_oonf_os_vif_subsystem.logging] & 4) == 0) {
        return -1;
      }
      oonf_log(4,(ulong)_oonf_os_vif_subsystem.logging,"src/base/os_linux/os_vif_linux.c",0x79,0,0,
               "Unknown vif type: %d",vVar1);
      return -1;
    }
    uVar6 = 0x1001;
  }
  __fd = open("/dev/net/tun",2);
  if (__fd < 0) {
    uVar8 = (ulong)_oonf_os_vif_subsystem.logging;
    iVar7 = -1;
    if (((&log_global_mask)[uVar8] & 4) != 0) {
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      oonf_log(4,uVar8,"src/base/os_linux/os_vif_linux.c",0x7f,0,0,
               "Cannot open virtual interface device: %s (%d)",pcVar5,*piVar4);
    }
  }
  else {
    if_req.ifr_ifru.ifru_map.mem_start = 0;
    if_req.ifr_ifru.ifru_map.mem_end = 0;
    if_req.ifr_ifrn._0_8_ = 0;
    if_req.ifr_ifrn._8_8_ = 0;
    if_req.ifr_ifru._16_8_ = 0;
    strscpy(&if_req,vif,0x10);
    if_req.ifr_ifru.ifru_addr.sa_family = uVar6;
    iVar7 = 0;
    iVar3 = ioctl(__fd,0x400454ca,&if_req);
    oVar2 = _oonf_os_vif_subsystem.logging;
    if (iVar3 < 0) {
      if (((&log_global_mask)[_oonf_os_vif_subsystem.logging] & 4) != 0) {
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        oonf_log(4,oVar2,"src/base/os_linux/os_vif_linux.c",0x8d,0,0,
                 "Cannot set mode of virtual interface device: %s (%d)",pcVar5,*piVar4);
      }
      close(__fd);
      iVar7 = -1;
    }
    else {
      sock->fd = __fd;
      sock->_flags = OS_FD_ACTIVE;
      os_fd_generic_set_nonblocking(sock);
      (vif->_vif_node).key = vif;
      avl_insert(&_vif_tree,&vif->_vif_node);
    }
  }
  return iVar7;
}

Assistant:

int
os_vif_linux_open(struct os_fd *sock, struct os_vif *vif) {
  struct ifreq if_req;
  int fd, flag;

  switch (vif->type) {
    case OS_VIF_MAC:
      flag = IFF_TAP;
      break;
    case OS_VIF_IP:
      flag = IFF_TUN;
      break;
    default:
      OONF_WARN(LOG_OS_VIF, "Unknown vif type: %d", vif->type);
      return -1;
  }

  fd = open("/dev/net/tun", O_RDWR);
  if (fd < 0) {
    OONF_WARN(LOG_OS_VIF, "Cannot open virtual interface device: %s (%d)", strerror(errno), errno);
    return -1;
  }

  memset(&if_req, 0, sizeof(if_req));
  strscpy(if_req.ifr_name, vif->if_name, IF_NAMESIZE);

  /*
   * Specify the IFF_TAP flag for Ethernet packets.
   * Specify IFF_NO_PI for not receiving extra meta packet information.
   */
  if_req.ifr_flags = flag | IFF_NO_PI;

  if (ioctl(fd, TUNSETIFF, (void *)&if_req) < 0) {
    OONF_WARN(LOG_OS_VIF, "Cannot set mode of virtual interface device: %s (%d)", strerror(errno), errno);
    close(fd);
    return -1;
  }

  /* initialize OONF file descriptor */
  os_fd_init(sock, fd);
  os_fd_set_nonblocking(sock);

  /* initialize vif memory */
  vif->_vif_node.key = vif->if_name;
  avl_insert(&_vif_tree, &vif->_vif_node);

  return 0;
}